

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::rotateLeft
          (BTreeImpl *this,Parent *left,Parent *right,Parent *parent,uint indexInParent,
          MaybeUint **fixup)

{
  bool bVar1;
  size_t mid;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_48;
  Fault f;
  DebugExpression<bool> _kjCondition;
  MaybeUint **fixup_local;
  uint indexInParent_local;
  Parent *parent_local;
  Parent *right_local;
  Parent *left_local;
  BTreeImpl *this_local;
  
  f.exception._6_1_ = Parent::isHalfFull(left);
  f.exception._7_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x2a9,FAILED,"left.isHalfFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    Debug::Fault::fatal(&local_48);
  }
  f_1.exception._2_1_ = Parent::isMostlyFull(right);
  f_1.exception._3_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f_1.exception + 3));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&mid,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x2aa,FAILED,"right.isMostlyFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f_1.exception + 3));
    Debug::Fault::fatal((Fault *)&mid);
  }
  left->keys[3].i = parent->keys[indexInParent].i;
  if (*fixup == parent->keys + indexInParent) {
    *fixup = left->keys + 3;
  }
  parent->keys[indexInParent].i = right->keys[0].i;
  left->children[4] = right->children[0];
  amove<kj::_::BTreeImpl::MaybeUint>(right->keys,right->keys + 1,6);
  MaybeUint::operator=(right->keys + 6,(void *)0x0);
  amove<unsigned_int>(right->children,right->children + 1,7);
  right->children[7] = 0;
  return;
}

Assistant:

void BTreeImpl::rotateLeft(
    Parent& left, Parent& right, Parent& parent, uint indexInParent, MaybeUint*& fixup) {
  // Steal one item from the right node and move it to the left node.

  // Like merge(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(left.isHalfFull());
  KJ_DASSERT(right.isMostlyFull());

  constexpr size_t mid = Parent::NKEYS/2;
  left.keys[mid] = parent.keys[indexInParent];
  if (fixup == &parent.keys[indexInParent]) fixup = &left.keys[mid];
  parent.keys[indexInParent] = right.keys[0];
  left.children[mid + 1] = right.children[0];
  amove(right.keys, right.keys + 1, Parent::NKEYS - 1);
  right.keys[Parent::NKEYS - 1] = nullptr;
  amove(right.children, right.children + 1, Parent::NCHILDREN - 1);
  right.children[Parent::NCHILDREN - 1] = 0;
}